

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O1

void __thiscall
math::wide_integer::uintwide_t<32U,_unsigned_int,_void,_true>::eval_divide_knuth
          (uintwide_t<32U,_unsigned_int,_void,_true> *this,
          uintwide_t<32U,_unsigned_int,_void,_true> *other,
          uintwide_t<32U,_unsigned_int,_void,_true> *remainder)

{
  value_type_conflict vVar1;
  uint uVar2;
  value_type_conflict vVar3;
  uint uVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  int iVar7;
  long lVar9;
  ulong uVar10;
  byte bVar11;
  undefined8 uVar8;
  
  vVar1 = (this->values).super_array<unsigned_int,_1UL>.elems[0];
  if ((other->values).super_array<unsigned_int,_1UL>.elems[0] == 0) {
    (this->values).super_array<unsigned_int,_1UL>.elems[0] = 0x7fffffff;
  }
  else if (vVar1 != 0) {
    uVar2 = (other->values).super_array<unsigned_int,_1UL>.elems[0];
    vVar3 = (this->values).super_array<unsigned_int,_1UL>.elems[0];
    bVar11 = 0xff;
    if (((int)uVar2 < 0 || -1 < (int)vVar3) && (bVar11 = 1, -1 < (int)uVar2 || (int)vVar3 < 0)) {
      lVar9 = 0;
      do {
        bVar11 = 0;
        if (lVar9 == -4) break;
        uVar4 = *(uint *)((long)(this->values).super_array<unsigned_int,_1UL>.elems + lVar9);
        uVar5 = *(uint *)((long)(other->values).super_array<unsigned_int,_1UL>.elems + lVar9);
        bVar11 = -(uVar4 <= uVar5) | 1;
        lVar9 = lVar9 + -4;
      } while (uVar4 == uVar5);
    }
    if (bVar11 != 0) {
      if (bVar11 == 0xff) {
        if (remainder != (uintwide_t<32U,_unsigned_int,_void,_true> *)0x0) {
          (remainder->values).super_array<unsigned_int,_1UL>.elems[0] = vVar3;
        }
        (this->values).super_array<unsigned_int,_1UL>.elems[0] = 0;
        return;
      }
      if (vVar1 == 0) {
        uVar10 = 0;
        iVar7 = 0;
      }
      else {
        lVar9 = (ulong)(vVar1 != 0) << 2;
        uVar8 = 0;
        uVar10 = 0;
        do {
          uVar10 = CONCAT44((int)uVar10 - (int)uVar8 * uVar2,
                            *(undefined4 *)
                             ((long)this[-1].values.super_array<unsigned_int,_1UL>.elems + lVar9));
          auVar6._8_8_ = 0;
          auVar6._0_8_ = uVar10;
          uVar8 = SUB168(auVar6 / ZEXT416(uVar2),0);
          iVar7 = SUB164(auVar6 / ZEXT416(uVar2),0);
          *(int *)((long)this[-1].values.super_array<unsigned_int,_1UL>.elems + lVar9) = iVar7;
          lVar9 = lVar9 + -4;
        } while (lVar9 != 0);
      }
      if (remainder == (uintwide_t<32U,_unsigned_int,_void,_true> *)0x0) {
        return;
      }
      (remainder->values).super_array<unsigned_int,_1UL>.elems[0] = (int)uVar10 - iVar7 * uVar2;
      return;
    }
    (this->values).super_array<unsigned_int,_1UL>.elems[0] = 1;
  }
  if (remainder == (uintwide_t<32U,_unsigned_int,_void,_true> *)0x0) {
    return;
  }
  (remainder->values).super_array<unsigned_int,_1UL>.elems[0] = 0;
  return;
}

Assistant:

constexpr auto eval_divide_knuth(const uintwide_t& other, uintwide_t* remainder = nullptr) -> void
    {
      // Use Knuth's long division algorithm.
      // The loop-ordering of indices in Knuth's original
      // algorithm has been reversed due to the data format
      // used here. Several optimizations and combinations
      // of logic have been carried out in the source code.

      // See also:
      // D.E. Knuth, "The Art of Computer Programming, Volume 2:
      // Seminumerical Algorithms", Addison-Wesley (1998),
      // Section 4.3.1 Algorithm D and Exercise 16.

      using local_uint_index_type = unsigned_fast_type;

      local_uint_index_type u_offset { };
      local_uint_index_type v_offset { };

      auto crit_u =       values.crbegin();
      auto crit_v = other.values.crbegin();

      while(crit_u != values.crend() && (*crit_u == static_cast<limb_type>(UINT8_C(0)))) // NOLINT(altera-id-dependent-backward-branch)
      {
        ++crit_u;
        ++u_offset;
      }

      while(crit_v != other.values.crend() && (*crit_v == static_cast<limb_type>(UINT8_C(0)))) // NOLINT(altera-id-dependent-backward-branch)
      {
        ++crit_v;
        ++v_offset;
      }

      if(v_offset == static_cast<local_uint_index_type>(number_of_limbs))
      {
        // The denominator is zero. Set the maximum value and return.
        // This also catches (0 / 0) and sets the maximum value for it.
        static_cast<void>(operator=(limits_helper_max<IsSigned>())); // LCOV_EXCL_LINE

        if(remainder != nullptr) // LCOV_EXCL_LINE
        {
          detail::fill_unsafe(remainder->values.begin(), remainder->values.end(), static_cast<limb_type>(UINT8_C(0))); // LCOV_EXCL_LINE
        }
      }
      else if(u_offset == static_cast<local_uint_index_type>(number_of_limbs))
      {
        // The numerator is zero. Do nothing and return.

        if(remainder != nullptr)
        {
          *remainder = uintwide_t(static_cast<std::uint8_t>(UINT8_C(0)));
        }
      }
      else
      {
        const auto result_of_compare_left_with_right = compare(other);

        const auto left_is_less_than_right = (result_of_compare_left_with_right == INT8_C(-1));
        const auto left_is_equal_to_right  = (result_of_compare_left_with_right == INT8_C( 0));

        if(left_is_less_than_right)
        {
          // If the denominator is larger than the numerator,
          // then the result of the division is zero.
          if(remainder != nullptr)
          {
            *remainder = *this;
          }

          operator=(static_cast<std::uint8_t>(UINT8_C(0)));
        }
        else if(left_is_equal_to_right)
        {
          // If the denominator is equal to the numerator,
          // then the result of the division is one.
          operator=(static_cast<std::uint8_t>(UINT8_C(1)));

          if(remainder != nullptr)
          {
            *remainder = uintwide_t(static_cast<std::uint8_t>(UINT8_C(0)));
          }
        }
        else
        {
          eval_divide_knuth_core(u_offset, v_offset, other, remainder);
        }
      }
    }